

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O3

uint32_t __thiscall
BamTools::Internal::BamWriterPrivate::CalculateMinimumBin(BamWriterPrivate *this,int begin,int end)

{
  uint32_t uVar1;
  int iVar2;
  
  iVar2 = end + -1;
  if (begin >> 0xe == iVar2 >> 0xe) {
    return (begin >> 0xe) + 0x1249;
  }
  if (begin >> 0x11 == iVar2 >> 0x11) {
    return (begin >> 0x11) + 0x249;
  }
  if (begin >> 0x14 == iVar2 >> 0x14) {
    return (begin >> 0x14) + 0x49;
  }
  if (begin >> 0x17 == iVar2 >> 0x17) {
    return (begin >> 0x17) + 9;
  }
  uVar1 = 0;
  if (begin >> 0x1a == iVar2 >> 0x1a) {
    uVar1 = (begin >> 0x1a) + 1;
  }
  return uVar1;
}

Assistant:

uint32_t BamWriterPrivate::CalculateMinimumBin(const int begin, int end) const
{
    --end;
    if ((begin >> 14) == (end >> 14)) {
        return 4681 + (begin >> 14);
    }
    if ((begin >> 17) == (end >> 17)) {
        return 585 + (begin >> 17);
    }
    if ((begin >> 20) == (end >> 20)) {
        return 73 + (begin >> 20);
    }
    if ((begin >> 23) == (end >> 23)) {
        return 9 + (begin >> 23);
    }
    if ((begin >> 26) == (end >> 26)) {
        return 1 + (begin >> 26);
    }
    return 0;
}